

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall
cmCTest::PopulateCustomVector
          (cmCTest *this,cmMakefile *mf,string *def,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  pointer pbVar1;
  cmValue value;
  ostream *poVar2;
  pointer pbVar3;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  value = cmMakefile::GetDefinition(mf,def);
  if (value.Value != (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"PopulateCustomVector: ",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(def->_M_dataplus)._M_p,def->_M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc53,(char *)local_1c8,false);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(vec,(vec->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
    cmList::Insert(vec,(vec->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,value.Value,Yes,No);
    pbVar3 = (vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar1) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  -- ",5);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length
                           );
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0xc58,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
  }
  return;
}

Assistant:

void cmCTest::PopulateCustomVector(cmMakefile* mf, const std::string& def,
                                   std::vector<std::string>& vec)
{
  cmValue dval = mf->GetDefinition(def);
  if (!dval) {
    return;
  }
  cmCTestLog(this, DEBUG, "PopulateCustomVector: " << def << std::endl);

  cmList::assign(vec, *dval);

  for (std::string const& it : vec) {
    cmCTestLog(this, DEBUG, "  -- " << it << std::endl);
  }
}